

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addThreshold(DdManager *dd,DdNode **f,DdNode **g)

{
  DdManager *pDVar1;
  DdNode *G;
  DdNode *F;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)*f;
  pDVar1 = (DdManager *)*g;
  if ((dd_local != pDVar1) && (dd_local != (DdManager *)dd->plusinfinity)) {
    if (((dd_local->sentinel).index == 0x7fffffff) && ((pDVar1->sentinel).index == 0x7fffffff)) {
      if ((dd_local->sentinel).type.value < (pDVar1->sentinel).type.value) {
        dd_local = (DdManager *)dd->zero;
      }
    }
    else {
      dd_local = (DdManager *)0x0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addThreshold(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G || F == DD_PLUS_INFINITY(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) >= cuddV(G)) {
            return(F);
        } else {
            return(DD_ZERO(dd));
        }
    }
    return(NULL);

}